

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Holding.cpp
# Opt level: O2

void __thiscall Holding::Holding(Holding *this,string *n,int t,int spT,int c,int val)

{
  string local_50;
  
  std::__cxx11::string::string((string *)&local_50,(string *)n);
  BlackCard::BlackCard(&this->super_BlackCard,&local_50,t);
  std::__cxx11::string::~string((string *)&local_50);
  (this->super_BlackCard).super_Card._vptr_Card = (_func_int **)&PTR_effectBonus_00116368;
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  (this->name)._M_string_length = 0;
  (this->name).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_assign((string *)&this->name);
  this->typeH = spT;
  this->tapped = false;
  this->revealed = false;
  this->cost = c;
  this->harvestValue = val;
  this->upperHolding = (Holding *)0x0;
  this->subHolding = (Holding *)0x0;
  return;
}

Assistant:

Holding::Holding(string n, int t, int spT, int c, int val): BlackCard{n, t}
{
    name = n;
    typeH = Holdings(spT);

    tapped = false;
    revealed = false;

    cost = c;
    harvestValue = val;

    subHolding = nullptr;
    upperHolding = nullptr;
}